

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebServer.cpp
# Opt level: O1

void __thiscall WebServer::returnConn(WebServer *this,HttpConnPtr *conn)

{
  EventLoop *this_00;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  this_00 = this->loop_;
  peVar1 = (conn->super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (conn->super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (conn->super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  (conn->super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38 = (code *)0x0;
  pcStack_30 = (code *)0x0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_48._M_unused._M_object = operator_new(0x28);
  *(code **)local_48._M_unused._0_8_ = returnConnInLoop;
  *(undefined8 *)((long)local_48._M_unused._0_8_ + 8) = 0;
  *(element_type **)((long)local_48._M_unused._0_8_ + 0x10) = peVar1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_48._M_unused._0_8_ + 0x18) = p_Var2
  ;
  *(WebServer **)((long)local_48._M_unused._0_8_ + 0x20) = this;
  pcStack_30 = std::
               _Function_handler<void_(),_std::_Bind<void_(WebServer::*(WebServer_*,_std::shared_ptr<HttpConn>))(std::shared_ptr<HttpConn>)>_>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(),_std::_Bind<void_(WebServer::*(WebServer_*,_std::shared_ptr<HttpConn>))(std::shared_ptr<HttpConn>)>_>
             ::_M_manager;
  EventLoop::runInLoop(this_00,(Functor *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  return;
}

Assistant:

void WebServer::returnConn(HttpConnPtr conn) {
    loop_->runInLoop(std::bind(&WebServer::returnConnInLoop, this, std::move(conn)));
}